

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O1

void avx::RgbToBgr(uint8_t *outY,uint8_t *inY,uint8_t *outYEnd,uint32_t rowSizeOut,
                  uint32_t rowSizeIn,uint8_t colorCount,uint32_t simdWidth,uint32_t totalSimdWidth,
                  uint32_t nonSimdWidth)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  long lVar3;
  uint8_t *puVar4;
  ulong uVar5;
  uint8_t *puVar6;
  
  auVar2 = _DAT_001dd800;
  if (outY != outYEnd) {
    do {
      puVar4 = inY;
      puVar6 = outY;
      if (totalSimdWidth != 0) {
        uVar5 = 0;
        do {
          auVar1 = vpshufb_avx2(*(undefined1 (*) [32])(inY + uVar5),auVar2);
          *(undefined1 (*) [32])(outY + uVar5) = auVar1;
          outY[uVar5 + 0xf] = inY[uVar5 + 0x11];
          outY[uVar5 + 0x11] = inY[uVar5 + 0xf];
          uVar5 = uVar5 + simdWidth;
        } while (totalSimdWidth != uVar5);
        puVar4 = inY + uVar5;
        puVar6 = outY + uVar5;
      }
      if ((nonSimdWidth != 0) && (puVar6 != outY + (ulong)nonSimdWidth + (ulong)totalSimdWidth)) {
        lVar3 = 0;
        do {
          puVar6[lVar3 + 2] = puVar4[lVar3];
          puVar6[lVar3 + 1] = puVar4[lVar3 + 1];
          puVar6[lVar3] = puVar4[lVar3 + 2];
          lVar3 = lVar3 + (ulong)colorCount;
        } while (puVar6 + lVar3 != outY + (ulong)nonSimdWidth + (ulong)totalSimdWidth);
      }
      outY = outY + rowSizeOut;
      inY = inY + rowSizeIn;
    } while (outY != outYEnd);
  }
  return;
}

Assistant:

void RgbToBgr( uint8_t * outY, const uint8_t * inY, const uint8_t * outYEnd, uint32_t rowSizeOut, uint32_t rowSizeIn, 
                   const uint8_t colorCount, uint32_t simdWidth, uint32_t totalSimdWidth, uint32_t nonSimdWidth )
    {
        const simd ctrl = _mm256_setr_epi8(2, 1, 0, 5, 4, 3, 8, 7, 6, 11, 10, 9, 14, 13, 12, 15, 
                                           16, 17, 20, 19, 18, 23, 22, 21, 26, 25, 24, 29, 28, 27, 30, 31);
        for( ; outY != outYEnd; outY += rowSizeOut, inY += rowSizeIn ) {
            const uint8_t * inX  = inY;
            uint8_t       * outX = outY;

            const uint8_t * outXEnd = outX + totalSimdWidth;

            for( ; outX != outXEnd; outX += simdWidth, inX += simdWidth ) {
                const simd * src = reinterpret_cast<const simd*> (inX);
                simd * dst = reinterpret_cast<simd*> (outX);
                simd result = _mm256_loadu_si256( src );
                result = _mm256_shuffle_epi8( result, ctrl );
                _mm256_storeu_si256( dst, result );
                *(outX + 15) = *(inX + 17);
                *(outX + 17) = *(inX + 15);
            }

            if( nonSimdWidth > 0 ) {
                const uint8_t * outXEndNonSimd = outXEnd + nonSimdWidth;
                for( ; outX != outXEndNonSimd; outX += colorCount, inX += colorCount ) {
                    *(outX + 2) = *(inX);
                    *(outX + 1) = *(inX + 1);
                    *(outX) = *(inX + 2);
                }
            }
        }
    }